

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* exact_lookup_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string_view symbol)

{
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  basic_string_view<char,_std::char_traits<char>_> *lib;
  pointer pbVar1;
  vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> symbols;
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  size_t local_50;
  char *local_48;
  vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> local_40;
  
  lookup(&local_40,symbol,exact);
  if (local_40.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if ((long)local_40.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x38) {
      __assert_fail("symbols.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp"
                    ,0xa3,"std::vector<std::string> exact_lookup(string_view)");
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Symbol_lib_entry::get_libs_view
              (&local_68,
               local_40.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>.
               _M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,
              (long)local_68.
                    super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    if (local_68.
        super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar1 = local_68.
               super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_48 = pbVar1->_M_str;
        local_50 = pbVar1->_M_len;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*,unsigned_long>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_48,&local_50);
        pbVar1 = pbVar1 + 1;
      } while (pbVar1 != local_68.
                         super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_68.
        super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> exact_lookup(string_view symbol) {
	auto symbols = lookup(symbol, Search_type::exact);
	if (symbols.empty()) {
		return {};
	};
	assert(symbols.size() == 1);
	std::vector<std::string> retval;
	const auto &libs = symbols.front().get_libs_view();
	retval.reserve(libs.size());
	//std::copy(std::begin(libs), std::end(libs), std::back_inserter(retval));
	for (auto &lib : libs) {
		retval.emplace_back(lib.data(), lib.size());
	}
	return retval;
}